

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O0

int __thiscall
Parse::TPTP::addPredicate(TPTP *this,string *name,int arity,bool *added,TermList *arg)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  string *in_RSI;
  undefined8 *in_R8;
  bool *in_stack_000000d0;
  uint in_stack_000000dc;
  string *in_stack_000000e0;
  Signature *in_stack_000000e8;
  TermList *in_stack_00000148;
  bool *in_stack_00000150;
  int in_stack_00000158;
  int in_stack_0000015c;
  string *in_stack_00000160;
  TPTP *in_stack_00000168;
  Interpretation in_stack_00000180;
  Interpretation in_stack_00000188;
  Interpretation in_stack_00000190;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  TermList in_stack_fffffffffffffe48;
  string local_138 [32];
  string local_118 [32];
  TermList local_f8;
  undefined8 local_f0;
  TermList local_e8;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [48];
  string local_50 [32];
  undefined8 *local_30;
  uint local_4;
  
  local_30 = in_R8;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
     , bVar1)) {
    return -1;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (bVar1) {
    std::__cxx11::string::string(local_50,in_RSI);
    local_4 = addOverloadedPredicate
                        (in_stack_00000168,in_stack_00000160,in_stack_0000015c,in_stack_00000158,
                         in_stack_00000150,in_stack_00000148,in_stack_00000180,in_stack_00000188,
                         in_stack_00000190);
    std::__cxx11::string::~string(local_50);
    return local_4;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (bVar1) {
    std::__cxx11::string::string(local_80,in_RSI);
    local_4 = addOverloadedPredicate
                        (in_stack_00000168,in_stack_00000160,in_stack_0000015c,in_stack_00000158,
                         in_stack_00000150,in_stack_00000148,in_stack_00000180,in_stack_00000188,
                         in_stack_00000190);
    std::__cxx11::string::~string(local_80);
    return local_4;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (bVar1) {
    std::__cxx11::string::string(local_a0,in_RSI);
    local_4 = addOverloadedPredicate
                        (in_stack_00000168,in_stack_00000160,in_stack_0000015c,in_stack_00000158,
                         in_stack_00000150,in_stack_00000148,in_stack_00000180,in_stack_00000188,
                         in_stack_00000190);
    std::__cxx11::string::~string(local_a0);
    return local_4;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (bVar1) {
    std::__cxx11::string::string(local_c0,in_RSI);
    local_4 = addOverloadedPredicate
                        (in_stack_00000168,in_stack_00000160,in_stack_0000015c,in_stack_00000158,
                         in_stack_00000150,in_stack_00000148,in_stack_00000180,in_stack_00000188,
                         in_stack_00000190);
    std::__cxx11::string::~string(local_c0);
    return local_4;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (bVar1) {
    std::__cxx11::string::string(local_e0,in_RSI);
    local_4 = addOverloadedPredicate
                        (in_stack_00000168,in_stack_00000160,in_stack_0000015c,in_stack_00000158,
                         in_stack_00000150,in_stack_00000148,in_stack_00000180,in_stack_00000188,
                         in_stack_00000190);
    std::__cxx11::string::~string(local_e0);
    return local_4;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    if (bVar1) {
      std::__cxx11::string::string(local_138,in_RSI);
      local_4 = addOverloadedPredicate
                          (in_stack_00000168,in_stack_00000160,in_stack_0000015c,in_stack_00000158,
                           in_stack_00000150,in_stack_00000148,in_stack_00000180,in_stack_00000188,
                           in_stack_00000190);
      std::__cxx11::string::~string(local_138);
      return local_4;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    if (!bVar1) {
      uVar2 = Kernel::Signature::addPredicate
                        (in_stack_000000e8,in_stack_000000e0,in_stack_000000dc,in_stack_000000d0);
      return uVar2;
    }
    return -2;
  }
  local_f0 = *local_30;
  local_e8 = sortOf((TPTP *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                    in_stack_fffffffffffffe48);
  local_f8 = Kernel::AtomicSort::intSort();
  bVar1 = Kernel::TermList::operator!=(&local_e8,&local_f8);
  if (!bVar1) {
    std::__cxx11::string::string(local_118,in_RSI);
    local_4 = addOverloadedPredicate
                        (in_stack_00000168,in_stack_00000160,in_stack_0000015c,in_stack_00000158,
                         in_stack_00000150,in_stack_00000148,in_stack_00000180,in_stack_00000188,
                         in_stack_00000190);
    std::__cxx11::string::~string(local_118);
    return local_4;
  }
  uVar3 = __cxa_allocate_exception(0x50);
  Lib::UserErrorException::Exception
            ((UserErrorException *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  __cxa_throw(uVar3,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException)
  ;
}

Assistant:

int TPTP::addPredicate(std::string name,int arity,bool& added,TermList& arg)
{
  if (name == "$evaleq" || name == "$equal") {
    return -1;
  }
  if (name == "$less") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_LESS,
				  Theory::RAT_LESS,
				  Theory::REAL_LESS);
  }
  if (name == "$lesseq") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_LESS_EQUAL,
				  Theory::RAT_LESS_EQUAL,
				  Theory::REAL_LESS_EQUAL);
  }
  if (name == "$greater") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_GREATER,
				  Theory::RAT_GREATER,
				  Theory::REAL_GREATER);
  }
  if (name == "$greatereq") {
    return addOverloadedPredicate(name,arity,2,added,arg,
				  Theory::INT_GREATER_EQUAL,
				  Theory::RAT_GREATER_EQUAL,
				  Theory::REAL_GREATER_EQUAL);
  }
  if (name == "$is_int") {
    return addOverloadedPredicate(name,arity,1,added,arg,
				  Theory::INT_IS_INT,
				  Theory::RAT_IS_INT,
				  Theory::REAL_IS_INT);
  }
  if (name == "$divides"){
    if(sortOf(arg)!=AtomicSort::intSort()){
      USER_ERROR("$divides can only be used with integer type");
    }
    return addOverloadedPredicate(name,arity,2,added,arg,
                                  Theory::INT_DIVIDES,
                                  Theory::INT_DIVIDES,  // will not be used
                                  Theory::INT_DIVIDES); // will not be used
  }
  if (name == "$is_rat") {
    return addOverloadedPredicate(name,arity,1,added,arg,
				  Theory::INT_IS_RAT,
				  Theory::RAT_IS_RAT,
				  Theory::REAL_IS_RAT);
  } 
  if(name == "$distinct"){
    // special case for distinct, dealt with in formulaInfix
    return -2;
  }
  return env.signature->addPredicate(name,arity,added);
}